

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
parse_format_string<true,wchar_t,fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *handler
          )

{
  internal *end;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *this_00;
  char *message;
  internal *piVar1;
  writer write;
  id_adapter<fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&,_wchar_t>
  local_40;
  writer local_38;
  
  this_00 = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int> *)
            format_str.size_;
  end = this + (long)format_str.data_ * 4;
  local_38.handler_ = this_00;
  do {
    if (this == end) {
      return;
    }
    piVar1 = this;
    if (*(int *)this != 0x7b) {
      while( true ) {
        if (piVar1 == end) {
          parse_format_string<true,_wchar_t,_fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&>
          ::writer::operator()(&local_38,(wchar_t *)this,(wchar_t *)end);
          return;
        }
        if (*(wchar_t *)piVar1 == L'{') break;
        piVar1 = piVar1 + 4;
      }
    }
    parse_format_string<true,_wchar_t,_fmt::v5::internal::format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>_&>
    ::writer::operator()(&local_38,(wchar_t *)this,(wchar_t *)piVar1);
    piVar1 = piVar1 + 4;
    if (piVar1 == end) {
      message = "invalid format string";
      goto LAB_00191fba;
    }
    if ((char)*(int *)piVar1 == '}') {
      format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>::on_arg_id
                (this_00);
    }
    else if (*(int *)piVar1 != 0x7b) {
      local_40.handler = this_00;
      piVar1 = (internal *)
               parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>&,wchar_t>>
                         ((wchar_t *)piVar1,(wchar_t *)end,&local_40);
      if (piVar1 == end) {
LAB_00191fa2:
        message = "missing \'}\' in format string";
LAB_00191fba:
        error_handler::on_error((error_handler *)&this_00->context_,message);
        return;
      }
      if (*(wchar_t *)piVar1 != L'}') {
        if (*(wchar_t *)piVar1 != L':') goto LAB_00191fa2;
        piVar1 = (internal *)
                 format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_wchar_t[3],_int>::
                 on_format_specs(this_00,(wchar_t *)(piVar1 + 4),(wchar_t *)end);
        if ((piVar1 == end) || (*(wchar_t *)piVar1 != L'}')) {
          message = "unknown format specifier";
          goto LAB_00191fba;
        }
      }
    }
    this = piVar1 + 4;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}